

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QRectF * __thiscall
QGraphicsItemEffectSourcePrivate::paddedEffectRect
          (QGraphicsItemEffectSourcePrivate *this,CoordinateSystem system,PixmapPadMode mode,
          QRectF *sourceRect,bool *unpadded)

{
  bool bVar1;
  QGraphicsEffect *pQVar2;
  int in_ECX;
  int in_EDX;
  qreal in_RSI;
  QRectF *in_RDI;
  QRectF *in_R8;
  undefined1 *in_R9;
  long in_FS_OFFSET;
  QRectF deviceRect;
  QSizeF *in_stack_fffffffffffffea8;
  QRectF *this_00;
  qreal local_118;
  qreal local_110;
  qreal local_108;
  qreal local_100;
  qreal local_f8;
  qreal local_f0;
  qreal local_e8;
  qreal local_e0;
  qreal local_d8;
  qreal local_d0;
  qreal local_c8;
  qreal local_c0;
  QSizeF local_b8;
  QSizeF local_a8;
  qreal local_98;
  qreal local_90;
  qreal local_88;
  qreal local_80;
  qreal local_78;
  qreal local_70;
  qreal local_68;
  qreal local_60;
  bool local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->xp = -NAN;
  in_RDI->yp = -NAN;
  in_RDI->w = -NAN;
  in_RDI->h = -NAN;
  this_00 = in_RDI;
  QRectF::QRectF(in_RDI);
  if (in_R9 != (undefined1 *)0x0) {
    *in_R9 = 0;
  }
  if (in_ECX == 2) {
    if (*(long *)((long)in_RSI + 0x98) == 0) {
      pQVar2 = QGraphicsItem::graphicsEffect((QGraphicsItem *)0x98faba);
      (**(code **)(*(long *)pQVar2 + 0x60))(&local_f8,pQVar2,in_R8);
      in_RDI->xp = local_f8;
      in_RDI->yp = local_f0;
      in_RDI->w = local_e8;
      in_RDI->h = local_e0;
    }
    else {
      local_78 = -NAN;
      local_70 = -NAN;
      local_68 = -NAN;
      local_60 = -NAN;
      if (in_EDX == 0) {
        local_78 = in_R8->xp;
        local_70 = in_R8->yp;
        local_68 = in_R8->w;
        local_60 = in_R8->h;
      }
      else {
        QPainter::worldTransform();
        QTransform::mapRect((QRectF *)&local_78);
      }
      pQVar2 = QGraphicsItem::graphicsEffect((QGraphicsItem *)0x98f96c);
      (**(code **)(*(long *)pQVar2 + 0x60))(&local_98,pQVar2,&local_78);
      in_RDI->xp = local_98;
      in_RDI->yp = local_90;
      in_RDI->w = local_88;
      in_RDI->h = local_80;
      if (in_R9 != (undefined1 *)0x0) {
        local_a8 = QRectF::size(this_00);
        local_b8 = QRectF::size(this_00);
        bVar1 = ::operator==((QSizeF *)in_RDI,in_stack_fffffffffffffea8);
        *in_R9 = bVar1;
      }
      if ((*(long *)((long)in_RSI + 0x98) != 0) && (in_EDX == 1)) {
        QPainter::worldTransform();
        QTransform::inverted(local_58);
        QTransform::mapRect((QRectF *)&local_d8);
        in_RDI->xp = local_d8;
        in_RDI->yp = local_d0;
        in_RDI->w = local_c8;
        in_RDI->h = local_c0;
      }
    }
  }
  else if (in_ECX == 1) {
    QRectF::adjusted(in_R8,(qreal)in_R9,in_RSI,(qreal)this_00,(qreal)in_RDI);
    in_RDI->xp = local_118;
    in_RDI->yp = local_110;
    in_RDI->w = local_108;
    in_RDI->h = local_100;
  }
  else {
    in_RDI->xp = in_R8->xp;
    in_RDI->yp = in_R8->yp;
    in_RDI->w = in_R8->w;
    in_RDI->h = in_R8->h;
    if (in_R9 != (undefined1 *)0x0) {
      *in_R9 = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QRectF QGraphicsItemEffectSourcePrivate::paddedEffectRect(Qt::CoordinateSystem system, QGraphicsEffect::PixmapPadMode mode, const QRectF &sourceRect, bool *unpadded) const
{
    QRectF effectRectF;

    if (unpadded)
        *unpadded = false;

    if (mode == QGraphicsEffect::PadToEffectiveBoundingRect) {
        if (info) {
            QRectF deviceRect = system == Qt::DeviceCoordinates ? sourceRect : info->painter->worldTransform().mapRect(sourceRect);
            effectRectF = item->graphicsEffect()->boundingRectFor(deviceRect);
            if (unpadded)
                *unpadded = (effectRectF.size() == sourceRect.size());
            if (info && system == Qt::LogicalCoordinates)
                effectRectF = info->painter->worldTransform().inverted().mapRect(effectRectF);
        } else {
            // no choice but to send a logical coordinate bounding rect to boundingRectFor
            effectRectF = item->graphicsEffect()->boundingRectFor(sourceRect);
        }
    } else if (mode == QGraphicsEffect::PadToTransparentBorder) {
        // adjust by 1.5 to account for cosmetic pens
        effectRectF = sourceRect.adjusted(-1.5, -1.5, 1.5, 1.5);
    } else {
        effectRectF = sourceRect;
        if (unpadded)
            *unpadded = true;
    }

    return effectRectF;
}